

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1539::run(TestCase1539 *this)

{
  size_t sVar1;
  ulong uVar2;
  ReaderOptions options;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  MessageSizeCounts MVar4;
  Reader root;
  Runnable local_3d0;
  ListReader *local_3c8;
  BuilderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct>_>_> listList;
  ReaderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>_>
  listListReader;
  SegmentArrayMessageReader reader;
  Fault f;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_270;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&root,&builder.super_MessageBuilder);
  reader.super_MessageReader.options._8_8_ = root._reader.data;
  reader.super_MessageReader.options.traversalLimitInWords = (uint64_t)root._reader.capTable;
  PointerBuilder::initStruct((StructBuilder *)&f,(PointerBuilder *)&reader,(StructSize)0x10000);
  reader.super_MessageReader._vptr_MessageReader = (_func_int **)f.exception;
  reader.super_MessageReader.options.traversalLimitInWords =
       (uint64_t)aStack_270.value.ownFile.content.ptr;
  reader.super_MessageReader.options._8_8_ = aStack_270.value.ownFile.content.disposer;
  PointerBuilder::initList(&listList.builder,(PointerBuilder *)&reader,POINTER,500);
  if (listList.builder.elementCount != 0) {
    uVar2 = 0;
    do {
      reader.super_MessageReader.options._8_8_ =
           listList.builder.ptr + (listList.builder.step * uVar2 >> 3);
      reader.super_MessageReader._vptr_MessageReader = (_func_int **)listList.builder.segment;
      reader.super_MessageReader.options.traversalLimitInWords = (uint64_t)listList.builder.capTable
      ;
      PointerBuilder::initStructList
                ((ListBuilder *)&f,(PointerBuilder *)&reader,0x10000000,(StructSize)0x0);
      uVar2 = uVar2 + 1;
    } while (uVar2 < listList.builder.elementCount);
  }
  AVar3 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((_func_int **)AVar3.size_ == (_func_int **)0x1) {
    segments = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    options._8_8_ = 0x40;
    options.traversalLimitInWords = 0x800000;
    SegmentArrayMessageReader::SegmentArrayMessageReader(&reader,segments,options);
    MessageReader::getRootInternal((Reader *)&listListReader,&reader.super_MessageReader);
    aStack_270.value.ownFile.content.size_ = (size_t)listListReader.reader.ptr;
    aStack_270.value.ownFile.content.disposer = (ArrayDisposer *)listListReader.reader._24_8_;
    f.exception = (Exception *)listListReader.reader.segment;
    aStack_270.value.ownFile.content.ptr = (char *)listListReader.reader.capTable;
    PointerReader::getStruct(&root._reader,(PointerReader *)&f,(word *)0x0);
    if (root._reader.pointerCount == 0) {
      root._reader.nestingLimit = 0x7fffffff;
      root._reader.capTable = (CapTableReader *)0x0;
      root._reader.pointers = (WirePointer *)0x0;
      f.exception = (Exception *)0x0;
    }
    else {
      f.exception = (Exception *)CONCAT44(root._reader.segment._4_4_,root._reader.segment._0_4_);
    }
    aStack_270._16_4_ = root._reader.nestingLimit;
    aStack_270.value.ownFile.content.ptr = (char *)root._reader.capTable;
    aStack_270.value.ownFile.content.size_ = (size_t)root._reader.pointers;
    PointerReader::getList(&listListReader.reader,(PointerReader *)&f,POINTER,(word *)0x0);
    local_3d0._vptr_Runnable = (_func_int **)&PTR_run_003732e0;
    local_3c8 = &listListReader.reader;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&f,&local_3d0);
    if ((char)f.exception == '\x01') {
      kj::Exception::~Exception(&aStack_270.value);
    }
    else if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[84]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x612,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { listListReader[0]; }) != nullptr\""
                 ,(char (*) [84])
                  "failed: expected kj::runCatchingExceptions([&]() { listListReader[0]; }) != nullptr"
                );
    }
    local_3d0._vptr_Runnable = (_func_int **)&PTR_run_00373310;
    local_3c8 = &listListReader.reader;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&f,&local_3d0);
    if ((char)f.exception == '\x01') {
      kj::Exception::~Exception(&aStack_270.value);
    }
    else if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[85]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x613,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { listListReader[10]; }) != nullptr\""
                 ,(char (*) [85])
                  "failed: expected kj::runCatchingExceptions([&]() { listListReader[10]; }) != nullptr"
                );
    }
    sVar1 = (AVar3.ptr)->size_;
    MVar4 = StructReader::totalSize(&root._reader);
    if ((sVar1 - 1 != MVar4.wordCount) && (kj::_::Debug::minSeverity < 3)) {
      local_3d0._vptr_Runnable = (_func_int **)((AVar3.ptr)->size_ - 1);
      MVar4 = StructReader::totalSize(&root._reader);
      f.exception = (Exception *)MVar4.wordCount;
      aStack_270._0_4_ = MVar4.capCount;
      kj::_::Debug::log<char_const(&)[74],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x615,ERROR,
                 "\"failed: expected \" \"(segments[0].size() - 1) == (root.totalSize().wordCount)\", segments[0].size() - 1, root.totalSize().wordCount"
                 ,(char (*) [74])
                  "failed: expected (segments[0].size() - 1) == (root.totalSize().wordCount)",
                 (unsigned_long *)&local_3d0,(unsigned_long *)&f);
    }
    SegmentArrayMessageReader::~SegmentArrayMessageReader(&reader);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  root._reader.segment._0_4_ = 1;
  reader.super_MessageReader._vptr_MessageReader = (_func_int **)AVar3.size_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x60d,FAILED,"(1) == (segments.size())","1, segments.size()",(int *)&root,
             (unsigned_long *)&reader);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Encoding, EmptyStructListAmplification) {
  MallocMessageBuilder builder(1024);
  auto listList = builder.initRoot<test::TestAnyPointer>().getAnyPointerField()
      .initAs<List<List<test::TestEmptyStruct>>>(500);

  for (uint i = 0; i < listList.size(); i++) {
    listList.init(i, 1u << 28);
  }

  auto segments = builder.getSegmentsForOutput();
  ASSERT_EQ(1, segments.size());

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());
  auto root = reader.getRoot<test::TestAnyPointer>();
  auto listListReader = root.getAnyPointerField().getAs<List<List<TestAllTypes>>>();
  EXPECT_NONFATAL_FAILURE(listListReader[0]);
  EXPECT_NONFATAL_FAILURE(listListReader[10]);

  EXPECT_EQ(segments[0].size() - 1, root.totalSize().wordCount);
}